

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

wchar_t parse_hex_nibble(char c)

{
  undefined4 local_c;
  char c_local;
  
  if ((c < '0') || ('9' < c)) {
    if ((c < 'a') || ('f' < c)) {
      local_c = L'\xffffffff';
    }
    else {
      local_c = c + L'\xffffffa9';
    }
  }
  else {
    local_c = c + L'\xffffffd0';
  }
  return local_c;
}

Assistant:

static int
parse_hex_nibble(char c)
{
	if (c >= '0' && c <= '9')
		return c - '0';
	if (c >= 'a' && c <= 'f')
		return 10 + c - 'a';
#if 0
	/* XXX: Is uppercase something we should support? */
	if (c >= 'A' && c <= 'F')
		return 10 + c - 'A';
#endif

	return -1;
}